

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void AdjustOpenGLLogicalScalingPoint(int *x,int *y)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  int iVar3;
  SDL_Rect SVar4;
  int physical_h;
  int physical_w;
  undefined8 local_28;
  
  if (VideoWindow20 != (SDL_Window *)0x0 && OpenGLLogicalScalingFBO != 0) {
    local_28 = in_RAX;
    (*SDL20_GetWindowSize)(VideoWindow20,(int *)((long)&local_28 + 4),(int *)&local_28);
    SVar4 = GetOpenGLLogicalScalingViewport(local_28._4_4_,(int)local_28);
    iVar1 = OpenGLLogicalScalingHeight;
    iVar3 = (int)((float)(*x - SVar4.x) * ((float)OpenGLLogicalScalingWidth / (float)SVar4.w));
    iVar2 = (int)((float)(*y - SVar4.y) * ((float)OpenGLLogicalScalingHeight / (float)SVar4.h));
    if (OpenGLLogicalScalingWidth < iVar3) {
      iVar3 = OpenGLLogicalScalingWidth;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    *x = iVar3;
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    *y = iVar2;
  }
  return;
}

Assistant:

static void
AdjustOpenGLLogicalScalingPoint(int *x, int *y)
{
    SDL_Rect viewport;
    int physical_w, physical_h;
    float scale_x, scale_y;
    int adjusted_x, adjusted_y;

    /* Don't adjust anything if we're not using Logical Scaling */
    if (!OpenGLLogicalScalingFBO || !VideoWindow20) {
        return;
    }

    /* we want to scale based on the window size, which is dpi-scaled */
    SDL20_GetWindowSize(VideoWindow20, &physical_w, &physical_h);
    viewport = GetOpenGLLogicalScalingViewport(physical_w, physical_h);

    scale_x = (float)OpenGLLogicalScalingWidth / viewport.w;
    scale_y = (float)OpenGLLogicalScalingHeight / viewport.h;

    adjusted_x = (int) ((*x - viewport.x) * scale_x);
    adjusted_y = (int) ((*y - viewport.y) * scale_y);

    /* Clamp the result to the visible window */
    *x = SDL_max(SDL_min(adjusted_x, OpenGLLogicalScalingWidth), 0);
    *y = SDL_max(SDL_min(adjusted_y, OpenGLLogicalScalingHeight), 0);
}